

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_BLOCK_SIZE,_int,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **pp_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined1 *puVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  tuple<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_BLOCK_SIZE,_int,_int>
  *__tmp;
  
  bVar4 = AtEnd(this);
  if (!bVar4) {
    puVar5 = (undefined8 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>_*,_false>
                         + 0x28))();
    puVar6 = (undefined8 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Head_base<1UL,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>_*,_false>
                         + 0x28))();
    puVar7 = (undefined1 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Head_base<2UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<BLOCK_SIZE>,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_false>
                         + 0x28))();
    puVar8 = (undefined4 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Head_base<3UL,_testing::internal::ParamIterator<int>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                         + 0x28))();
    puVar9 = (undefined4 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                                   .super__Tuple_impl<4UL,_testing::internal::ParamIterator<int>_>.
                                   super__Head_base<4UL,_testing::internal::ParamIterator<int>,_false>
                                   ._M_head_impl + 0x28))();
    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
    p_Var10->_M_use_count = 1;
    p_Var10->_M_weak_count = 1;
    p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0103a750;
    *(undefined4 *)&p_Var10[1]._vptr__Sp_counted_base = *puVar9;
    *(undefined4 *)((long)&p_Var10[1]._vptr__Sp_counted_base + 4) = *puVar8;
    *(undefined1 *)&p_Var10[1]._M_use_count = *puVar7;
    pp_Var1 = (_func_int **)*puVar6;
    uVar2 = puVar6[1];
    uVar3 = puVar6[3];
    p_Var10[3]._vptr__Sp_counted_base = (_func_int **)puVar6[2];
    p_Var10[3]._M_use_count = (int)uVar3;
    p_Var10[3]._M_weak_count = (int)((ulong)uVar3 >> 0x20);
    p_Var10[2]._vptr__Sp_counted_base = pp_Var1;
    p_Var10[2]._M_use_count = (int)uVar2;
    p_Var10[2]._M_weak_count = (int)((ulong)uVar2 >> 0x20);
    pp_Var1 = (_func_int **)*puVar5;
    uVar2 = puVar5[1];
    uVar3 = puVar5[3];
    p_Var10[5]._vptr__Sp_counted_base = (_func_int **)puVar5[2];
    p_Var10[5]._M_use_count = (int)uVar3;
    p_Var10[5]._M_weak_count = (int)((ulong)uVar3 >> 0x20);
    p_Var10[4]._vptr__Sp_counted_base = pp_Var1;
    p_Var10[4]._M_use_count = (int)uVar2;
    p_Var10[4]._M_weak_count = (int)((ulong)uVar2 >> 0x20);
    (this->current_value_).
    super___shared_ptr<std::tuple<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_BLOCK_SIZE,_int,_int>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var10 + 1);
    this_00 = (this->current_value_).
              super___shared_ptr<std::tuple<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_BLOCK_SIZE,_int,_int>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->current_value_).
    super___shared_ptr<std::tuple<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_BLOCK_SIZE,_int,_int>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var10;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }